

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionShaderResources
          (DeviceContextVkImpl *this,IShaderResourceBinding *pShaderResourceBinding)

{
  bool bVar1;
  Char *pCVar2;
  ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this_00;
  ShaderResourceCacheImplType *this_01;
  ShaderResourceCacheVk *ResourceCache;
  ShaderResourceBindingVkImpl *pResBindingVkImpl;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  IShaderResourceBinding *pShaderResourceBinding_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = pShaderResourceBinding;
  bVar1 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator!
                    (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (!bVar1) {
    FormatString<char[56]>
              ((string *)local_38,
               (char (*) [56])"State transitions are not allowed inside a render pass.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"TransitionShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x20c);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (msg.field_2._8_8_ == 0) {
    FormatString<char[40]>((string *)&pResBindingVkImpl,(char (*) [40])0xe34774);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"TransitionShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x20d);
    std::__cxx11::string::~string((string *)&pResBindingVkImpl);
  }
  this_00 = &ClassPtrCast<Diligent::ShaderResourceBindingVkImpl,Diligent::IShaderResourceBinding>
                       ((IShaderResourceBinding *)msg.field_2._8_8_)->
             super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>;
  this_01 = ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetResourceCache(this_00);
  ShaderResourceCacheVk::TransitionResources<false>(this_01,this);
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionShaderResources(IShaderResourceBinding* pShaderResourceBinding)
{
    DEV_CHECK_ERR(!m_pActiveRenderPass, "State transitions are not allowed inside a render pass.");
    DEV_CHECK_ERR(pShaderResourceBinding != nullptr, "pShaderResourceBinding must not be null");

    ShaderResourceBindingVkImpl* pResBindingVkImpl = ClassPtrCast<ShaderResourceBindingVkImpl>(pShaderResourceBinding);
    ShaderResourceCacheVk&       ResourceCache     = pResBindingVkImpl->GetResourceCache();

    ResourceCache.TransitionResources<false>(this);
}